

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric_manager.hpp
# Opt level: O0

shared_ptr<ylt::metric::basic_static_gauge<double>_> __thiscall
ylt::metric::static_metric_manager<ylt::metric::ylt_system_tag_t>::
get_metric_static<ylt::metric::basic_static_gauge<double>>
          (static_metric_manager<ylt::metric::ylt_system_tag_t> *this,string *name)

{
  bool bVar1;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ylt::metric::static_metric>_>,_true>
  __r;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  element_type *in_RDI;
  shared_ptr<ylt::metric::basic_static_gauge<double>_> sVar3;
  iterator it;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ylt::metric::static_metric>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ylt::metric::static_metric>_>_>_>
  *in_stack_ffffffffffffffb8;
  element_type *this_00;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ylt::metric::static_metric>_>,_true>
  local_20 [4];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  
  this_00 = in_RDI;
  local_20[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ylt::metric::static_metric>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ylt::metric::static_metric>_>_>_>
       ::find(in_stack_ffffffffffffffb8,(key_type *)0x275ad4);
  __r._M_cur = (__node_type *)
               std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ylt::metric::static_metric>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ylt::metric::static_metric>_>_>_>
               ::end(in_stack_ffffffffffffffb8);
  bVar1 = std::__detail::operator==
                    (local_20,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ylt::metric::static_metric>_>,_true>
                               *)&stack0xffffffffffffffd8);
  if (bVar1) {
    std::shared_ptr<ylt::metric::basic_static_gauge<double>_>::shared_ptr
              ((shared_ptr<ylt::metric::basic_static_gauge<double>_> *)this_00,
               in_stack_ffffffffffffffb8);
    _Var2._M_pi = extraout_RDX;
  }
  else {
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ylt::metric::static_metric>_>,_false,_true>
    ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ylt::metric::static_metric>_>,_false,_true>
                  *)0x275b17);
    sVar3 = std::
            dynamic_pointer_cast<ylt::metric::basic_static_gauge<double>,ylt::metric::static_metric>
                      ((shared_ptr<ylt::metric::static_metric> *)__r._M_cur);
    _Var2 = sVar3.
            super___shared_ptr<ylt::metric::basic_static_gauge<double>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  }
  sVar3.super___shared_ptr<ylt::metric::basic_static_gauge<double>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var2._M_pi;
  sVar3.super___shared_ptr<ylt::metric::basic_static_gauge<double>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = in_RDI;
  return (shared_ptr<ylt::metric::basic_static_gauge<double>_>)
         sVar3.
         super___shared_ptr<ylt::metric::basic_static_gauge<double>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<T> get_metric_static(const std::string& name) {
    static_assert(std::is_base_of_v<static_metric, T>,
                  "must be dynamic metric");
    auto it = metric_map_.find(name);
    if (it == metric_map_.end()) {
      return nullptr;
    }
    return std::dynamic_pointer_cast<T>(it->second);
  }